

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O2

void EvpathDestroyWriter(CP_Services Svcs,DP_WS_Stream WS_Stream_v)

{
  long lVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < *(int *)((long)WS_Stream_v + 0x58); lVar2 = lVar2 + 1) {
    lVar1 = *(long *)((long)*(void **)((long)WS_Stream_v + 0x60) + lVar2 * 8);
    if (lVar1 != 0) {
      free((void *)**(undefined8 **)(lVar1 + 0x38));
      free(*(void **)(*(long *)(*(long *)((long)WS_Stream_v + 0x60) + lVar2 * 8) + 0x38));
      free((void *)**(undefined8 **)
                     (*(long *)(*(long *)((long)WS_Stream_v + 0x60) + lVar2 * 8) + 0x30));
      lVar1 = *(long *)(*(long *)((long)WS_Stream_v + 0x60) + lVar2 * 8);
      if (*(long *)(*(long *)(lVar1 + 0x30) + 8) != 0) {
        CMConnection_dereference();
        lVar1 = *(long *)((long)WS_Stream_v + 0x60);
        *(undefined8 *)(*(long *)(*(long *)(lVar1 + lVar2 * 8) + 0x30) + 8) = 0;
        lVar1 = *(long *)(lVar1 + lVar2 * 8);
      }
      free(*(void **)(lVar1 + 0x20));
      free(*(void **)(*(long *)(*(long *)((long)WS_Stream_v + 0x60) + lVar2 * 8) + 0x30));
      free(*(void **)(*(long *)((long)WS_Stream_v + 0x60) + lVar2 * 8));
    }
  }
  free(*(void **)((long)WS_Stream_v + 0x60));
  free(WS_Stream_v);
  return;
}

Assistant:

static void EvpathDestroyWriter(CP_Services Svcs, DP_WS_Stream WS_Stream_v)
{
    Evpath_WS_Stream WS_Stream = (Evpath_WS_Stream)WS_Stream_v;
    for (int i = 0; i < WS_Stream->ReaderCount; i++)
    {
        if (WS_Stream->Readers[i])
        {
            free(WS_Stream->Readers[i]->WriterContactInfo->ContactString);
            free(WS_Stream->Readers[i]->WriterContactInfo);
            free(WS_Stream->Readers[i]->ReaderContactInfo->ContactString);
            if (WS_Stream->Readers[i]->ReaderContactInfo->Conn)
            {
                CMConnection_dereference(WS_Stream->Readers[i]->ReaderContactInfo->Conn);
                WS_Stream->Readers[i]->ReaderContactInfo->Conn = NULL;
            }
            if (WS_Stream->Readers[i]->ReaderRequestArray)
            {
                free(WS_Stream->Readers[i]->ReaderRequestArray);
            }
            free(WS_Stream->Readers[i]->ReaderContactInfo);
            free(WS_Stream->Readers[i]);
        }
    }
    free(WS_Stream->Readers);
    free(WS_Stream);
}